

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcWin.c
# Opt level: O2

void Wlc_WinCompute(Wlc_Ntk_t *p,Wlc_Obj_t *pObj,Vec_Int_t *vLeaves,Vec_Int_t *vNodes)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Wlc_Obj_t *pWVar4;
  int i;
  
  vLeaves->nSize = 0;
  vNodes->nSize = 0;
  iVar1 = Wlc_ObjHasArithm_rec(p,pObj);
  if (iVar1 != 0) {
    Wlc_WinCompute_rec(p,pObj,vLeaves,vNodes);
    Wlc_WinCleanMark_rec(p,pObj);
    return;
  }
  iVar1 = Wlc_ObjHasArithmFanins(p,pObj);
  if (iVar1 != 0) {
    for (iVar1 = 0; uVar3 = pObj->nFanins, iVar1 < (int)uVar3; iVar1 = iVar1 + 1) {
      iVar2 = Wlc_ObjFaninId(pObj,iVar1);
      pWVar4 = Wlc_NtkObj(p,iVar2);
      iVar2 = Wlc_ObjHasArithm_rec(p,pWVar4);
      if (iVar2 != 0) {
        Wlc_WinCompute_rec(p,pWVar4,vLeaves,vNodes);
      }
    }
    for (iVar1 = 0; iVar1 < (int)uVar3; iVar1 = iVar1 + 1) {
      iVar2 = Wlc_ObjFaninId(pObj,iVar1);
      pWVar4 = Wlc_NtkObj(p,iVar2);
      iVar2 = Wlc_ObjHasArithm_rec(p,pWVar4);
      if (iVar2 != 0) {
        Wlc_WinCleanMark_rec(p,pWVar4);
      }
      uVar3 = pObj->nFanins;
    }
    return;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcWin.c"
                ,0x82,"void Wlc_WinCompute(Wlc_Ntk_t *, Wlc_Obj_t *, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

void Wlc_WinCompute( Wlc_Ntk_t * p, Wlc_Obj_t * pObj, Vec_Int_t * vLeaves, Vec_Int_t * vNodes )
{
    Vec_IntClear( vLeaves );
    Vec_IntClear( vNodes );
    if ( Wlc_ObjHasArithm_rec(p, pObj) )
    {
        Wlc_WinCompute_rec( p, pObj, vLeaves, vNodes );
        Wlc_WinCleanMark_rec( p, pObj );
    }
    else if ( Wlc_ObjHasArithmFanins(p, pObj) )
    {
        Wlc_Obj_t * pFanin;  int i;
        Wlc_ObjForEachFaninObj( p, pObj, pFanin, i )
            if ( Wlc_ObjHasArithm_rec(p, pFanin) )
                Wlc_WinCompute_rec( p, pFanin, vLeaves, vNodes );
        Wlc_ObjForEachFaninObj( p, pObj, pFanin, i )
            if ( Wlc_ObjHasArithm_rec(p, pFanin) )
                Wlc_WinCleanMark_rec( p, pFanin );
    }
    else assert( 0 );
}